

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O0

int fctkern__pass_filter(fctkern_t *nk,char *test_name)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  char *in_RSI;
  long in_RDI;
  int pass;
  char *prefix;
  size_t prefix_list_size;
  size_t prefix_i;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  fct_nlist_t *in_stack_ffffffffffffffd0;
  char *test_str;
  int local_4;
  
  if (in_RDI == 0) {
    __assert_fail("nk != ((void*)0) && \"invalid arg\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcherednik[P]libgha/src/3rd/fctx/fct.h"
                  ,0x8b9,"int fctkern__pass_filter(fctkern_t *, const char *)");
  }
  if (in_RSI != (char *)0x0) {
    sVar2 = strlen(in_RSI);
    if (sVar2 == 0) {
      __assert_fail("strlen(test_name) > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcherednik[P]libgha/src/3rd/fctx/fct.h"
                    ,0x8bb,"int fctkern__pass_filter(fctkern_t *, const char *)");
    }
    pcVar3 = (char *)fct_nlist__size((fct_nlist_t *)0x102a7c);
    if (pcVar3 == (char *)0x0) {
      local_4 = 1;
    }
    else {
      for (test_str = (char *)0x0; test_str != pcVar3; test_str = test_str + 1) {
        in_stack_ffffffffffffffd0 =
             (fct_nlist_t *)
             fct_nlist__at(in_stack_ffffffffffffffd0,
                           CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
        iVar1 = fct_filter_pass(in_RSI,test_str);
        if (iVar1 != 0) {
          return 1;
        }
        in_stack_ffffffffffffffcc = 0;
      }
      local_4 = 0;
    }
    return local_4;
  }
  __assert_fail("test_name != ((void*)0)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcherednik[P]libgha/src/3rd/fctx/fct.h"
                ,0x8ba,"int fctkern__pass_filter(fctkern_t *, const char *)");
}

Assistant:

static nbool_t
fctkern__pass_filter(fctkern_t *nk, char const *test_name)
{
    size_t prefix_i =0;
    size_t prefix_list_size =0;
    FCT_ASSERT( nk != NULL && "invalid arg");
    FCT_ASSERT( test_name != NULL );
    FCT_ASSERT( strlen(test_name) > 0 );
    prefix_list_size = fctkern__filter_cnt(nk);
    /* If there is no filter list, then we return FCT_TRUE always. */
    if ( prefix_list_size == 0 )
    {
        return FCT_TRUE;
    }
    /* Iterate through the prefix filter list, and see if we have
    anything that does not pass. All we require is ONE item that
    passes the test in order for us to succeed here. */
    for ( prefix_i = 0; prefix_i != prefix_list_size; ++prefix_i )
    {
        char const *prefix = (char const*)fct_nlist__at(
                                 &(nk->prefix_list), prefix_i
                             );
        nbool_t pass = fct_filter_pass(prefix, test_name);
        if ( pass )
        {
            return FCT_TRUE;
        }
    }
    /* Otherwise, we never managed to find a prefix that satisfied the
    supplied test name. Therefore we have failed to pass to the filter
    list test. */
    return FCT_FALSE;
}